

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uncompressed_stream.cpp
# Opt level: O0

void __thiscall
minibag::UncompressedStream::decompress
          (UncompressedStream *this,uint8_t *dest,uint dest_len,uint8_t *source,uint source_len)

{
  BagException *this_00;
  void *in_RCX;
  uint in_EDX;
  void *in_RSI;
  uint in_R8D;
  string *in_stack_ffffffffffffff88;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  if (in_EDX < in_R8D) {
    this_00 = (BagException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    BagException::BagException(this_00,in_stack_ffffffffffffff88);
    __cxa_throw(this_00,&BagException::typeinfo,BagException::~BagException);
  }
  memcpy(in_RSI,in_RCX,(ulong)in_R8D);
  return;
}

Assistant:

void UncompressedStream::decompress(uint8_t* dest, unsigned int dest_len, uint8_t* source, unsigned int source_len) {
    if (dest_len < source_len)
        throw BagException("dest_len not large enough");

    memcpy(dest, source, source_len);
}